

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O0

void OPENSSL_lh_doall_arg(_LHASH *lh,_func_void_void_ptr_void_ptr *func,void *arg)

{
  lhash_item_st *plVar1;
  LHASH_ITEM *local_38;
  LHASH_ITEM *cur;
  LHASH_ITEM *next;
  size_t i;
  void *arg_local;
  _func_void_void_ptr_void_ptr *func_local;
  _LHASH *lh_local;
  
  if (lh != (_LHASH *)0x0) {
    if (lh->callback_depth != 0xffffffff) {
      lh->callback_depth = lh->callback_depth + 1;
    }
    for (next = (LHASH_ITEM *)0x0; next < (LHASH_ITEM *)lh->num_buckets;
        next = (LHASH_ITEM *)((long)&next->data + 1)) {
      local_38 = lh->buckets[(long)next];
      while (local_38 != (LHASH_ITEM *)0x0) {
        plVar1 = local_38->next;
        (*func)(local_38->data,arg);
        local_38 = plVar1;
      }
    }
    if (lh->callback_depth != 0xffffffff) {
      lh->callback_depth = lh->callback_depth - 1;
    }
    lh_maybe_resize(lh);
  }
  return;
}

Assistant:

void OPENSSL_lh_doall_arg(_LHASH *lh, void (*func)(void *, void *), void *arg) {
  if (lh == NULL) {
    return;
  }

  if (lh->callback_depth < UINT_MAX) {
    // |callback_depth| is a saturating counter.
    lh->callback_depth++;
  }

  for (size_t i = 0; i < lh->num_buckets; i++) {
    LHASH_ITEM *next;
    for (LHASH_ITEM *cur = lh->buckets[i]; cur != NULL; cur = next) {
      next = cur->next;
      func(cur->data, arg);
    }
  }

  if (lh->callback_depth < UINT_MAX) {
    lh->callback_depth--;
  }

  // The callback may have added or removed elements and the non-zero value of
  // |callback_depth| will have suppressed any resizing. Thus any needed
  // resizing is done here.
  lh_maybe_resize(lh);
}